

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smach.c
# Opt level: O2

float smach(char *cmach)

{
  undefined2 in_FPUControlWord;
  float fVar1;
  int local_10 [2];
  int argument;
  
  switch(*cmach) {
  case 'B':
    fVar1 = 2.0;
    break;
  default:
    local_10[0] = 0;
    input_error("smach",local_10);
    fVar1 = 0.0;
    break;
  case 'E':
    fVar1 = 5.9604645e-08;
    break;
  case 'L':
    fVar1 = 128.0;
    break;
  case 'M':
    fVar1 = -125.0;
    break;
  case 'N':
    fVar1 = 24.0;
    break;
  case 'O':
    fVar1 = 3.4028235e+38;
    break;
  case 'P':
    fVar1 = 1.1920929e-07;
    break;
  case 'R':
    fVar1 = (float)(0x2dU >> ((byte)((ushort)in_FPUControlWord >> 9) & 6) & 3);
    break;
  case 'S':
  case 'U':
    fVar1 = 1.1754944e-38;
  }
  return fVar1;
}

Assistant:

float smach(char *cmach)
{
/*  -- SuperLU auxiliary routine (version 5.0) --   
    This uses C99 standard constants, and is thread safe.

    Must be compiled with "-std=c99" flag.


    Purpose   
    =======   

    SMACH returns single precision machine parameters.   

    Arguments   
    =========   

    CMACH   (input) CHARACTER*1   
            Specifies the value to be returned by SMACH:   
            = 'E' or 'e',   SMACH := eps   
            = 'S' or 's ,   SMACH := sfmin   
            = 'B' or 'b',   SMACH := base   
            = 'P' or 'p',   SMACH := eps*base   
            = 'N' or 'n',   SMACH := t   
            = 'R' or 'r',   SMACH := rnd   
            = 'M' or 'm',   SMACH := emin   
            = 'U' or 'u',   SMACH := rmin   
            = 'L' or 'l',   SMACH := emax   
            = 'O' or 'o',   SMACH := rmax   

            where   

            eps   = relative machine precision   
            sfmin = safe minimum, such that 1/sfmin does not overflow   
            base  = base of the machine   
            prec  = eps*base   
            t     = number of (base) digits in the mantissa   
            rnd   = 1.0 when rounding occurs in addition, 0.0 otherwise   
            emin  = minimum exponent before (gradual) underflow   
            rmin  = underflow threshold - base**(emin-1)   
            emax  = largest exponent before overflow   
            rmax  = overflow threshold  - (base**emax)*(1-eps)   

   ===================================================================== 
*/

    float sfmin, small, rmach;

    if (strncmp(cmach, "E", 1)==0) {
	rmach = FLT_EPSILON * 0.5;
    } else if (strncmp(cmach, "S", 1)==0) {
	sfmin = FLT_MIN;
	small = 1. / FLT_MAX;
	if (small >= sfmin) {
	    /* Use SMALL plus a bit, to avoid the possibility of rounding   
	       causing overflow when computing  1/sfmin. */
	    sfmin = small * (FLT_EPSILON*0.5 + 1.);
	}
	rmach = sfmin;
    } else if (strncmp(cmach, "B", 1)==0) {
	rmach = FLT_RADIX;
    } else if (strncmp(cmach, "P", 1)==0) {
	rmach = FLT_EPSILON * 0.5 * FLT_RADIX;
    } else if (strncmp(cmach, "N", 1)==0) {
	rmach = FLT_MANT_DIG;
    } else if (strncmp(cmach, "R", 1)==0) {
	rmach = FLT_ROUNDS;
    } else if (strncmp(cmach, "M", 1)==0) {
	rmach = FLT_MIN_EXP;
    } else if (strncmp(cmach, "U", 1)==0) {
	rmach = FLT_MIN;
    } else if (strncmp(cmach, "L", 1)==0) {
	rmach = FLT_MAX_EXP;
    } else if (strncmp(cmach, "O", 1)==0) {
	rmach = FLT_MAX;
    } else {
        int argument = 0;
        input_error("smach", &argument);
        rmach = 0;
    }

    return rmach;

}